

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O1

void dwarfstring_destructor(dwarfstring_s *g)

{
  if (g->s_malloc != '\0') {
    free(g->s_data);
    g->s_data = (char *)0x0;
    g->s_malloc = '\0';
  }
  g->s_data = "";
  g->s_size = 0;
  g->s_avail = 0;
  g->s_malloc = '\0';
  return;
}

Assistant:

void
dwarfstring_destructor(struct dwarfstring_s *g)
{
    if (g->s_malloc) {
        free(g->s_data);
        g->s_data   = 0;
        g->s_malloc = 0;
    }
    /*  The constructor sets all the fields, most to zero.
        s_data is set to point to static string ""
        s_malloc set to FALSE. */
    dwarfstring_constructor(g);
}